

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void encode_ext(upb_encstate *e,upb_MiniTableExtension *ext,upb_MessageValue ext_val,
               _Bool is_message_set)

{
  _Bool _Var1;
  upb_MiniTableSub local_38;
  upb_MiniTableSubInternal sub;
  upb_MiniTableExtension *puStack_28;
  _Bool is_message_set_local;
  upb_MiniTableExtension *ext_local;
  upb_encstate *e_local;
  upb_MessageValue ext_val_local;
  
  ext_val_local.int64_val = ext_val.str_val.size;
  e_local = (upb_encstate *)ext_val.array_val;
  sub._7_1_ = is_message_set;
  puStack_28 = ext;
  ext_local = (upb_MiniTableExtension *)e;
  if (is_message_set) {
    encode_msgset_item(e,ext,ext_val);
  }
  else {
    _Var1 = upb_MiniTableField_IsSubMessage(&ext->field_dont_copy_me__upb_internal_use_only);
    if (_Var1) {
      local_38.submsg_dont_copy_me__upb_internal_use_only =
           (upb_MiniTable *)&puStack_28->sub_dont_copy_me__upb_internal_use_only;
    }
    else {
      local_38 = puStack_28->sub_dont_copy_me__upb_internal_use_only;
    }
    encode_field((upb_encstate *)ext_local,(upb_Message *)&e_local,
                 (upb_MiniTableSubInternal *)&local_38,
                 &puStack_28->field_dont_copy_me__upb_internal_use_only);
  }
  return;
}

Assistant:

static void encode_ext(upb_encstate* e, const upb_MiniTableExtension* ext,
                       upb_MessageValue ext_val, bool is_message_set) {
  if (UPB_UNLIKELY(is_message_set)) {
    encode_msgset_item(e, ext, ext_val);
  } else {
    upb_MiniTableSubInternal sub;
    if (upb_MiniTableField_IsSubMessage(&ext->UPB_PRIVATE(field))) {
      sub.UPB_PRIVATE(submsg) = &ext->UPB_PRIVATE(sub).UPB_PRIVATE(submsg);
    } else {
      sub.UPB_PRIVATE(subenum) = ext->UPB_PRIVATE(sub).UPB_PRIVATE(subenum);
    }
    encode_field(e, &ext_val.UPB_PRIVATE(ext_msg_val), &sub,
                 &ext->UPB_PRIVATE(field));
  }
}